

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O1

parser_error parse_prefs_expr(parser *p)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  char *__s1;
  char f;
  char *expr;
  char local_19;
  char *local_18;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 != (void *)0x0) {
    pcVar3 = parser_getstr(p,"expr");
    pcVar3 = string_make(pcVar3);
    local_18 = pcVar3;
    __s1 = process_pref_file_expr(&local_18,&local_19);
    iVar1 = strcmp(__s1,"0");
    *(bool *)pvVar2 = iVar1 == 0;
    string_free(pcVar3);
    return PARSE_ERROR_NONE;
  }
  __assert_fail("d != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-prefs.c"
                ,0x249,"enum parser_error parse_prefs_expr(struct parser *)");
}

Assistant:

static enum parser_error parse_prefs_expr(struct parser *p)
{
	struct prefs_data *d = parser_priv(p);

	const char *v;
	char *str;
	char *expr;
	char f;

	assert(d != NULL);

	/* XXX this can be avoided with a rewrite of process_pref_file_expr */
	str = expr = string_make(parser_getstr(p, "expr"));

	/* Parse the expr */
	v = process_pref_file_expr(&expr, &f);

	/* Set flag */
	d->bypass = streq(v, "0");

	string_free(str);

	return PARSE_ERROR_NONE;
}